

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

float * stbir__decode_uint8_linear_scaled_AR(float *decodep,int width_times_channels,void *inputp)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [15];
  undefined1 auVar4 [14];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [14];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  unkuint9 Var17;
  undefined1 auVar18 [11];
  undefined1 auVar19 [14];
  undefined1 auVar20 [13];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  uint6 uVar23;
  undefined1 (*pauVar24) [16];
  byte *pbVar25;
  float *decode;
  float *pfVar26;
  float *pfVar27;
  undefined1 (*pauVar28) [16];
  float *pfVar29;
  uint uVar30;
  
  pfVar1 = decodep + width_times_channels;
  if (width_times_channels < 0x10) {
    pfVar26 = decodep;
    if (3 < width_times_channels) {
      do {
        decodep = pfVar26 + 4;
        *pfVar26 = (float)*(byte *)((long)inputp + 1) * 0.003921569;
        pfVar26[1] = (float)*inputp * 0.003921569;
        pfVar26[2] = (float)*(byte *)((long)inputp + 3) * 0.003921569;
        pfVar26[3] = (float)*(byte *)((long)inputp + 2) * 0.003921569;
        inputp = (void *)((long)inputp + 4);
        pfVar27 = pfVar26 + 8;
        pfVar26 = decodep;
      } while (pfVar27 <= pfVar1);
    }
    if (decodep < pfVar1) {
      pbVar25 = (byte *)((long)inputp + 1);
      do {
        *decodep = (float)*pbVar25 * 0.003921569;
        decodep[1] = (float)pbVar25[-1] * 0.003921569;
        decodep = decodep + 2;
        pbVar25 = pbVar25 + 2;
      } while (decodep < pfVar1);
    }
  }
  else {
    pfVar26 = pfVar1 + -0x10;
    pauVar24 = (undefined1 (*) [16])inputp;
    do {
      pfVar27 = decodep + 0x10;
      pfVar29 = pfVar26;
      pauVar28 = (undefined1 (*) [16])((long)inputp + (long)width_times_channels + -0x10);
      if (pfVar27 == pfVar1) {
        pfVar29 = pfVar27;
        pauVar28 = pauVar24 + 1;
      }
      if (pfVar27 <= pfVar26) {
        pauVar28 = pauVar24 + 1;
      }
      auVar2 = *pauVar24;
      auVar3[0xd] = 0;
      auVar3._0_13_ = auVar2._0_13_;
      auVar3[0xe] = auVar2[7];
      auVar5[0xc] = auVar2[6];
      auVar5._0_12_ = auVar2._0_12_;
      auVar5._13_2_ = auVar3._13_2_;
      auVar6[0xb] = 0;
      auVar6._0_11_ = auVar2._0_11_;
      auVar6._12_3_ = auVar5._12_3_;
      uVar30 = auVar6._11_4_;
      auVar7[10] = auVar2[5];
      auVar7._0_10_ = auVar2._0_10_;
      auVar7._11_4_ = uVar30;
      auVar12[9] = 0;
      auVar12._0_9_ = auVar2._0_9_;
      auVar12._10_5_ = auVar7._10_5_;
      auVar13[8] = auVar2[4];
      auVar13._0_8_ = auVar2._0_8_;
      auVar13._9_6_ = auVar12._9_6_;
      auVar16._7_8_ = 0;
      auVar16._0_7_ = auVar13._8_7_;
      Var17 = CONCAT81(SUB158(auVar16 << 0x40,7),auVar2[3]);
      auVar21._9_6_ = 0;
      auVar21._0_9_ = Var17;
      auVar18._1_10_ = SUB1510(auVar21 << 0x30,5);
      auVar18[0] = auVar2[2];
      auVar22._11_4_ = 0;
      auVar22._0_11_ = auVar18;
      auVar14[2] = auVar2[1];
      auVar14._0_2_ = auVar2._0_2_;
      auVar14._3_12_ = SUB1512(auVar22 << 0x20,3);
      auVar15._2_13_ = auVar14._2_13_;
      auVar15._0_2_ = auVar2._0_2_ & 0xff;
      auVar4._10_2_ = 0;
      auVar4._0_10_ = auVar15._0_10_;
      auVar4._12_2_ = (short)Var17;
      uVar23 = CONCAT42(auVar4._10_4_,auVar18._0_2_);
      auVar19._6_8_ = 0;
      auVar19._0_6_ = uVar23;
      auVar8._4_2_ = auVar14._2_2_;
      auVar8._0_4_ = auVar15._0_4_;
      auVar8._6_8_ = SUB148(auVar19 << 0x40,6);
      *decodep = (float)auVar8._4_4_ * 0.003921569;
      decodep[1] = (float)(auVar15._0_4_ & 0xffff) * 0.003921569;
      decodep[2] = (float)(auVar4._10_4_ >> 0x10) * 0.003921569;
      decodep[3] = (float)(int)uVar23 * 0.003921569;
      decodep[4] = (float)auVar7._10_2_ * 0.003921569;
      decodep[5] = (float)auVar13._8_2_ * 0.003921569;
      decodep[6] = (float)(uVar30 >> 0x18) * 0.003921569;
      decodep[7] = (float)(uVar30 >> 8 & 0xffff) * 0.003921569;
      uVar30 = CONCAT13(0,CONCAT12(auVar2[9],(ushort)auVar2[8]));
      auVar9[0xc] = auVar2[0xb];
      auVar9._0_12_ = ZEXT112(auVar2[0xc]) << 0x40;
      auVar10._10_3_ = auVar9._10_3_;
      auVar10._0_10_ = (unkuint10)auVar2[10] << 0x40;
      auVar20._5_8_ = 0;
      auVar20._0_5_ = auVar10._8_5_;
      auVar11[4] = auVar2[9];
      auVar11._0_4_ = uVar30;
      auVar11[5] = 0;
      auVar11._6_7_ = SUB137(auVar20 << 0x40,6);
      decodep[8] = (float)auVar11._4_4_ * 0.003921569;
      decodep[9] = (float)(uVar30 & 0xffff) * 0.003921569;
      decodep[10] = (float)(uint3)(auVar9._10_3_ >> 0x10) * 0.003921569;
      decodep[0xb] = (float)auVar10._8_4_ * 0.003921569;
      if (pfVar27 <= pfVar26) {
        pfVar29 = pfVar27;
      }
      decodep[0xc] = (float)auVar2[0xd] * 0.003921569;
      decodep[0xd] = (float)auVar2[0xc] * 0.003921569;
      decodep[0xe] = (float)auVar2[0xf] * 0.003921569;
      decodep[0xf] = (float)auVar2[0xe] * 0.003921569;
      pauVar24 = pauVar28;
      decodep = pfVar29;
    } while (pfVar27 != pfVar1);
  }
  return pfVar1;
}

Assistant:

static float * STBIR__CODER_NAME( stbir__decode_uint8_linear_scaled )( float * decodep, int width_times_channels, void const * inputp )
{
  float STBIR_STREAMOUT_PTR( * ) decode = decodep;
  float * decode_end = (float*) decode + width_times_channels;
  unsigned char const * input = (unsigned char const*)inputp;

  #ifdef STBIR_SIMD
  unsigned char const * end_input_m16 = input + width_times_channels - 16;
  if ( width_times_channels >= 16 )
  {
    decode_end -= 16;
    STBIR_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      #ifdef STBIR_SIMD8
      stbir__simdi i; stbir__simdi8 o0,o1;
      stbir__simdf8 of0, of1;
      STBIR_NO_UNROLL(decode);
      stbir__simdi_load( i, input );
      stbir__simdi8_expand_u8_to_u32( o0, o1, i );
      stbir__simdi8_convert_i32_to_float( of0, o0 );
      stbir__simdi8_convert_i32_to_float( of1, o1 );
      stbir__simdf8_mult( of0, of0, STBIR_max_uint8_as_float_inverted8);
      stbir__simdf8_mult( of1, of1, STBIR_max_uint8_as_float_inverted8);
      stbir__decode_simdf8_flip( of0 );
      stbir__decode_simdf8_flip( of1 );
      stbir__simdf8_store( decode + 0, of0 );
      stbir__simdf8_store( decode + 8, of1 );
      #else
      stbir__simdi i, o0, o1, o2, o3;
      stbir__simdf of0, of1, of2, of3;
      STBIR_NO_UNROLL(decode);
      stbir__simdi_load( i, input );
      stbir__simdi_expand_u8_to_u32( o0,o1,o2,o3,i);
      stbir__simdi_convert_i32_to_float( of0, o0 );
      stbir__simdi_convert_i32_to_float( of1, o1 );
      stbir__simdi_convert_i32_to_float( of2, o2 );
      stbir__simdi_convert_i32_to_float( of3, o3 );
      stbir__simdf_mult( of0, of0, STBIR__CONSTF(STBIR_max_uint8_as_float_inverted) );
      stbir__simdf_mult( of1, of1, STBIR__CONSTF(STBIR_max_uint8_as_float_inverted) );
      stbir__simdf_mult( of2, of2, STBIR__CONSTF(STBIR_max_uint8_as_float_inverted) );
      stbir__simdf_mult( of3, of3, STBIR__CONSTF(STBIR_max_uint8_as_float_inverted) );
      stbir__decode_simdf4_flip( of0 );
      stbir__decode_simdf4_flip( of1 );
      stbir__decode_simdf4_flip( of2 );
      stbir__decode_simdf4_flip( of3 );
      stbir__simdf_store( decode + 0,  of0 );
      stbir__simdf_store( decode + 4,  of1 );
      stbir__simdf_store( decode + 8,  of2 );
      stbir__simdf_store( decode + 12, of3 );
      #endif
      decode += 16;
      input += 16;
      if ( decode <= decode_end )
        continue;
      if ( decode == ( decode_end + 16 ) )
        break;
      decode = decode_end; // backup and do last couple
      input = end_input_m16;
    }
    return decode_end + 16;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  decode += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( decode <= decode_end )
  {
    STBIR_SIMD_NO_UNROLL(decode);
    decode[0-4] = ((float)(input[stbir__decode_order0])) * stbir__max_uint8_as_float_inverted;
    decode[1-4] = ((float)(input[stbir__decode_order1])) * stbir__max_uint8_as_float_inverted;
    decode[2-4] = ((float)(input[stbir__decode_order2])) * stbir__max_uint8_as_float_inverted;
    decode[3-4] = ((float)(input[stbir__decode_order3])) * stbir__max_uint8_as_float_inverted;
    decode += 4;
    input += 4;
  }
  decode -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( decode < decode_end )
  {
    STBIR_NO_UNROLL(decode);
    decode[0] = ((float)(input[stbir__decode_order0])) * stbir__max_uint8_as_float_inverted;
    #if stbir__coder_min_num >= 2
    decode[1] = ((float)(input[stbir__decode_order1])) * stbir__max_uint8_as_float_inverted;
    #endif
    #if stbir__coder_min_num >= 3
    decode[2] = ((float)(input[stbir__decode_order2])) * stbir__max_uint8_as_float_inverted;
    #endif
    decode += stbir__coder_min_num;
    input += stbir__coder_min_num;
  }
  #endif

  return decode_end;
}